

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_fail_example.cpp
# Opt level: O1

void foo2(int *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  
  iVar2 = std::uncaught_exceptions();
  iVar1 = *a;
  *a = 2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo2 a = ",9);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (iVar2 != -1) {
    iVar3 = std::uncaught_exceptions();
    if (iVar2 < iVar3) {
      *a = iVar1;
    }
  }
  return;
}

Assistant:

void foo2(int& a) {
  SAVER_FAIL(a); // State saver on fail.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  // Original state will not automatically restored, on scope leave when no exceptions have been thrown.
}